

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O1

const_iterator __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::lower_bound(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
              *this,QAbstractButton **key)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  const_iterator cVar6;
  
  uVar3 = (this->c).keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s;
  puVar1 = (ulong *)(this->c).keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.ptr;
  puVar2 = puVar1;
  if (0 < (long)uVar3) {
    do {
      uVar4 = uVar3 >> 1;
      uVar5 = ~uVar4 + uVar3;
      uVar3 = uVar4;
      if ((QAbstractButton *)puVar2[uVar4] < *key) {
        puVar2 = puVar2 + uVar4 + 1;
        uVar3 = uVar5;
      }
    } while (0 < (long)uVar3);
  }
  cVar6.i = (long)puVar2 - (long)puVar1 >> 3;
  cVar6.c = &this->c;
  return cVar6;
}

Assistant:

const_iterator lower_bound(const Key &key) const
    {
        return fromKeysIterator(std::lower_bound(c.keys.begin(), c.keys.end(), key, key_comp()));
    }